

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::Matcher<mp::StringLiteral>::Matcher(Matcher<mp::StringLiteral> *this,StringLiteral value)

{
  linked_ptr<const_testing::MatcherInterface<mp::StringLiteral>_> local_30;
  
  (this->super_MatcherBase<mp::StringLiteral>).impl_.value_ =
       (MatcherInterface<mp::StringLiteral> *)0x0;
  (this->super_MatcherBase<mp::StringLiteral>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::StringLiteral>).impl_.link_;
  (this->super_MatcherBase<mp::StringLiteral>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e2a88;
  local_30.value_ = (MatcherInterface<mp::StringLiteral> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001e6468;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       value.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.impl_;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<mp::StringLiteral>_>::operator=
            (&(this->super_MatcherBase<mp::StringLiteral>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<mp::StringLiteral>_>::~linked_ptr(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }